

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_ErrorMgr.cpp
# Opt level: O3

ErrorProvider * __thiscall axl::err::ErrorMgr::findProvider(ErrorMgr *this,Guid *guid)

{
  bool bVar1;
  IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
  IVar2;
  ErrorProvider *pEVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  bVar1 = sl::
          Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
          ::ensureExclusive(&(this->m_providerMap).
                             super_HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
                             .m_table);
  if (bVar1) {
    IVar2.m_p = (Entry *)sl::
                         HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
                         ::find(&(this->m_providerMap).
                                 super_HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
                                ,guid);
    if ((IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
         )IVar2.m_p !=
        (IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
         )0x0) {
      pEVar3 = ((IVar2.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_value;
      goto LAB_0011701b;
    }
  }
  pEVar3 = (ErrorProvider *)0x0;
LAB_0011701b:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return pEVar3;
}

Assistant:

ErrorProvider*
ErrorMgr::findProvider(const sl::Guid& guid) {
	sys::ScopeLock scopeLock(&m_lock);
	sl::HashTableIterator<sl::Guid, ErrorProvider*> it = m_providerMap.find(guid);
	return it ? it->m_value : NULL;
}